

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::ShaderSubroutine::FunctionalTest14_15::testIndicesAndLocations(FunctionalTest14_15 *this)

{
  bool bVar1;
  bool bVar2;
  uint local_1c;
  uint local_18;
  GLuint uniform;
  GLuint type;
  bool result;
  FunctionalTest14_15 *this_local;
  
  bVar2 = true;
  for (local_18 = 0; local_18 < 2; local_18 = local_18 + 1) {
    bVar1 = false;
    if (bVar2) {
      bVar1 = this->m_subroutine_indices[local_18][0] ==
              this->m_initial_subroutine_indices[local_18][0];
    }
    bVar2 = false;
    if (bVar1) {
      bVar2 = this->m_subroutine_indices[local_18][1] ==
              this->m_initial_subroutine_indices[local_18][1];
    }
  }
  for (local_1c = 0; local_1c < 2; local_1c = local_1c + 1) {
    bVar1 = bVar2 != false;
    bVar2 = false;
    if (bVar1) {
      bVar2 = this->m_subroutine_uniform_locations[local_1c] ==
              this->m_initial_subroutine_uniform_locations[local_1c];
    }
  }
  return bVar2;
}

Assistant:

bool FunctionalTest14_15::testIndicesAndLocations() const
{
	static const GLuint n_subroutine_types = 2;
	bool				result			   = true;

	/* Verify subroutine indices */
	for (GLuint type = 0; type < n_subroutine_types; ++type)
	{
		result = result && (m_subroutine_indices[type][0] == m_initial_subroutine_indices[type][0]);
		result = result && (m_subroutine_indices[type][1] == m_initial_subroutine_indices[type][1]);
	}

	/* Verify subroutine uniform locations */
	for (GLuint uniform = 0; uniform < n_subroutine_types; ++uniform)
	{
		result = result && (m_subroutine_uniform_locations[uniform] == m_initial_subroutine_uniform_locations[uniform]);
	}

	return result;
}